

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void reuse_conn(connectdata *old_conn,connectdata *conn)

{
  _Bool _Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  
  (*Curl_cfree)((old_conn->http_proxy).host.rawalloc);
  (*Curl_cfree)((old_conn->socks_proxy).host.rawalloc);
  Curl_free_primary_ssl_config(&old_conn->ssl_config);
  Curl_free_primary_ssl_config(&old_conn->proxy_ssl_config);
  conn->data = old_conn->data;
  _Var1 = (old_conn->bits).user_passwd;
  (conn->bits).user_passwd = _Var1;
  if (_Var1 == true) {
    (*Curl_cfree)(conn->user);
    conn->user = (char *)0x0;
    (*Curl_cfree)(conn->passwd);
    conn->passwd = (char *)0x0;
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = (char *)0x0;
    old_conn->passwd = (char *)0x0;
  }
  _Var1 = (old_conn->bits).proxy_user_passwd;
  (conn->bits).proxy_user_passwd = _Var1;
  if (_Var1 == true) {
    (*Curl_cfree)((conn->http_proxy).user);
    (conn->http_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).user);
    (conn->socks_proxy).user = (char *)0x0;
    (*Curl_cfree)((conn->http_proxy).passwd);
    (conn->http_proxy).passwd = (char *)0x0;
    (*Curl_cfree)((conn->socks_proxy).passwd);
    (conn->socks_proxy).passwd = (char *)0x0;
    (conn->http_proxy).user = (old_conn->http_proxy).user;
    (conn->socks_proxy).user = (old_conn->socks_proxy).user;
    (conn->http_proxy).passwd = (old_conn->http_proxy).passwd;
    (conn->socks_proxy).passwd = (old_conn->socks_proxy).passwd;
    (old_conn->socks_proxy).user = (char *)0x0;
    (old_conn->socks_proxy).passwd = (char *)0x0;
    (old_conn->http_proxy).user = (char *)0x0;
    (old_conn->http_proxy).passwd = (char *)0x0;
  }
  (*Curl_cfree)((conn->host).rawalloc);
  (conn->host).rawalloc = (char *)0x0;
  (*Curl_cfree)((conn->conn_to_host).rawalloc);
  (conn->conn_to_host).rawalloc = (char *)0x0;
  pcVar9 = (old_conn->host).rawalloc;
  pcVar10 = (old_conn->host).encalloc;
  pcVar11 = (old_conn->host).dispname;
  (conn->host).name = (old_conn->host).name;
  (conn->host).dispname = pcVar11;
  (conn->host).rawalloc = pcVar9;
  (conn->host).encalloc = pcVar10;
  uVar2 = *(undefined4 *)((long)&(old_conn->conn_to_host).rawalloc + 4);
  uVar3 = *(undefined4 *)&(old_conn->conn_to_host).encalloc;
  uVar4 = *(undefined4 *)((long)&(old_conn->conn_to_host).encalloc + 4);
  uVar5 = *(undefined4 *)&(old_conn->conn_to_host).name;
  uVar6 = *(undefined4 *)((long)&(old_conn->conn_to_host).name + 4);
  uVar7 = *(undefined4 *)&(old_conn->conn_to_host).dispname;
  uVar8 = *(undefined4 *)((long)&(old_conn->conn_to_host).dispname + 4);
  *(undefined4 *)&(conn->conn_to_host).rawalloc = *(undefined4 *)&(old_conn->conn_to_host).rawalloc;
  *(undefined4 *)((long)&(conn->conn_to_host).rawalloc + 4) = uVar2;
  *(undefined4 *)&(conn->conn_to_host).encalloc = uVar3;
  *(undefined4 *)((long)&(conn->conn_to_host).encalloc + 4) = uVar4;
  *(undefined4 *)&(conn->conn_to_host).name = uVar5;
  *(undefined4 *)((long)&(conn->conn_to_host).name + 4) = uVar6;
  *(undefined4 *)&(conn->conn_to_host).dispname = uVar7;
  *(undefined4 *)((long)&(conn->conn_to_host).dispname + 4) = uVar8;
  conn->conn_to_port = old_conn->conn_to_port;
  conn->remote_port = old_conn->remote_port;
  (*Curl_cfree)(conn->hostname_resolve);
  conn->hostname_resolve = (char *)0x0;
  conn->hostname_resolve = old_conn->hostname_resolve;
  old_conn->hostname_resolve = (char *)0x0;
  Curl_persistconninfo(conn);
  (conn->bits).reuse = true;
  (*Curl_cfree)(old_conn->user);
  old_conn->user = (char *)0x0;
  (*Curl_cfree)(old_conn->passwd);
  old_conn->passwd = (char *)0x0;
  (*Curl_cfree)(old_conn->options);
  old_conn->options = (char *)0x0;
  (*Curl_cfree)((old_conn->http_proxy).user);
  (old_conn->http_proxy).user = (char *)0x0;
  (*Curl_cfree)((old_conn->socks_proxy).user);
  (old_conn->socks_proxy).user = (char *)0x0;
  (*Curl_cfree)((old_conn->http_proxy).passwd);
  (old_conn->http_proxy).passwd = (char *)0x0;
  (*Curl_cfree)((old_conn->socks_proxy).passwd);
  (old_conn->socks_proxy).passwd = (char *)0x0;
  (*Curl_cfree)(old_conn->localdev);
  old_conn->localdev = (char *)0x0;
  Curl_llist_destroy(&old_conn->send_pipe,(void *)0x0);
  Curl_llist_destroy(&old_conn->recv_pipe,(void *)0x0);
  (*Curl_cfree)(old_conn->master_buffer);
  old_conn->master_buffer = (char *)0x0;
  (*Curl_cfree)(old_conn->unix_domain_socket);
  old_conn->unix_domain_socket = (char *)0x0;
  return;
}

Assistant:

static void reuse_conn(struct connectdata *old_conn,
                       struct connectdata *conn)
{
  free_idnconverted_hostname(&old_conn->http_proxy.host);
  free_idnconverted_hostname(&old_conn->socks_proxy.host);

  free(old_conn->http_proxy.host.rawalloc);
  free(old_conn->socks_proxy.host.rawalloc);

  /* free the SSL config struct from this connection struct as this was
     allocated in vain and is targeted for destruction */
  Curl_free_primary_ssl_config(&old_conn->ssl_config);
  Curl_free_primary_ssl_config(&old_conn->proxy_ssl_config);

  conn->data = old_conn->data;

  /* get the user+password information from the old_conn struct since it may
   * be new for this request even when we re-use an existing connection */
  conn->bits.user_passwd = old_conn->bits.user_passwd;
  if(conn->bits.user_passwd) {
    /* use the new user name and password though */
    Curl_safefree(conn->user);
    Curl_safefree(conn->passwd);
    conn->user = old_conn->user;
    conn->passwd = old_conn->passwd;
    old_conn->user = NULL;
    old_conn->passwd = NULL;
  }

  conn->bits.proxy_user_passwd = old_conn->bits.proxy_user_passwd;
  if(conn->bits.proxy_user_passwd) {
    /* use the new proxy user name and proxy password though */
    Curl_safefree(conn->http_proxy.user);
    Curl_safefree(conn->socks_proxy.user);
    Curl_safefree(conn->http_proxy.passwd);
    Curl_safefree(conn->socks_proxy.passwd);
    conn->http_proxy.user = old_conn->http_proxy.user;
    conn->socks_proxy.user = old_conn->socks_proxy.user;
    conn->http_proxy.passwd = old_conn->http_proxy.passwd;
    conn->socks_proxy.passwd = old_conn->socks_proxy.passwd;
    old_conn->http_proxy.user = NULL;
    old_conn->socks_proxy.user = NULL;
    old_conn->http_proxy.passwd = NULL;
    old_conn->socks_proxy.passwd = NULL;
  }

  /* host can change, when doing keepalive with a proxy or if the case is
     different this time etc */
  free_idnconverted_hostname(&conn->host);
  free_idnconverted_hostname(&conn->conn_to_host);
  Curl_safefree(conn->host.rawalloc);
  Curl_safefree(conn->conn_to_host.rawalloc);
  conn->host = old_conn->host;
  conn->conn_to_host = old_conn->conn_to_host;
  conn->conn_to_port = old_conn->conn_to_port;
  conn->remote_port = old_conn->remote_port;
  Curl_safefree(conn->hostname_resolve);

  conn->hostname_resolve = old_conn->hostname_resolve;
  old_conn->hostname_resolve = NULL;

  /* persist connection info in session handle */
  Curl_persistconninfo(conn);

  conn_reset_all_postponed_data(old_conn); /* free buffers */

  /* re-use init */
  conn->bits.reuse = TRUE; /* yes, we're re-using here */

  Curl_safefree(old_conn->user);
  Curl_safefree(old_conn->passwd);
  Curl_safefree(old_conn->options);
  Curl_safefree(old_conn->http_proxy.user);
  Curl_safefree(old_conn->socks_proxy.user);
  Curl_safefree(old_conn->http_proxy.passwd);
  Curl_safefree(old_conn->socks_proxy.passwd);
  Curl_safefree(old_conn->localdev);

  Curl_llist_destroy(&old_conn->send_pipe, NULL);
  Curl_llist_destroy(&old_conn->recv_pipe, NULL);

  Curl_safefree(old_conn->master_buffer);

#ifdef USE_UNIX_SOCKETS
  Curl_safefree(old_conn->unix_domain_socket);
#endif
}